

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O2

void do_cmd_alter_aux(wchar_t dir)

{
  short sVar1;
  chunk_conflict *c;
  player *p;
  _Bool _Var2;
  _Bool _Var3;
  loc grid;
  object *obj;
  object *obj_00;
  square *psVar4;
  trap_kind_conflict *ptVar5;
  char *fmt;
  wchar_t dir_local;
  
  dir_local = dir;
  grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[dir]);
  p = player;
  player->upkeep->energy_use = (uint)z_info->move_energy;
  _Var2 = player_confuse_dir(p,&dir_local,false);
  if (_Var2) {
    grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[dir_local]);
  }
  obj = chest_check(player,grid,CHEST_OPENABLE);
  obj_00 = chest_check(player,grid,CHEST_TRAPPED);
  psVar4 = square(cave,grid);
  if (0 < psVar4->mon) {
    py_attack(player,grid);
    goto LAB_0012c93a;
  }
  _Var2 = square_isdiggable(cave,grid);
  if (_Var2) {
    _Var2 = do_cmd_tunnel_aux(grid);
  }
  else {
    _Var2 = square_iscloseddoor(cave,grid);
    if (_Var2) {
      _Var2 = do_cmd_open_aux(grid);
    }
    else {
      _Var2 = square_isbasicmonstertrap(cave,grid);
      if (_Var2) {
        modify_monster_trap(grid);
        goto LAB_0012c93a;
      }
      _Var2 = square_isdisarmabletrap(cave,grid);
      if ((_Var2) || (_Var2 = square_isadvancedmonstertrap(cave,grid), _Var2)) {
        _Var2 = do_cmd_disarm_aux(grid);
      }
      else {
        _Var2 = flag_has_dbg((player->state).pflags,10,0x2f,"player->state.pflags","(PF_TRAP)");
        if ((_Var2) && (_Var2 = square_istrappable(cave,grid), _Var2)) {
          sVar1 = player->lev;
          _Var2 = flag_has_dbg((player->state).pflags,10,0x4d,"player->state.pflags",
                               "(PF_EXTRA_TRAP)");
          fmt = "You can not see to set a trap.";
          if ((player->timed[2] == 0) && (_Var3 = no_light(player), c = cave, !_Var3)) {
            fmt = "You are too confused.";
            if ((player->timed[4] == 0) && (player->timed[6] == 0)) {
              if (player->num_traps < (byte)(_Var2 + (0x18 < sVar1) + 1U)) {
                ptVar5 = lookup_trap("basic trap");
                place_trap((chunk *)c,grid,ptVar5->tidx,L'\0');
                fmt = "You set a monster trap.";
              }
              else {
                fmt = "You must disarm an existing trap to free up your equipment.";
              }
            }
          }
LAB_0012caa3:
          msg(fmt);
          goto LAB_0012c93a;
        }
        if (obj_00 == (object *)0x0) {
          if (obj == (object *)0x0) {
            _Var2 = square_isopendoor(cave,grid);
            if (_Var2) {
              do_cmd_close_aux(grid);
              goto LAB_0012c93a;
            }
            fmt = "You spin around.";
            goto LAB_0012caa3;
          }
          _Var2 = do_cmd_open_chest(grid,obj);
        }
        else {
          _Var2 = do_cmd_disarm_chest(obj_00);
        }
      }
    }
  }
  if (_Var2 != false) {
    return;
  }
LAB_0012c93a:
  disturb(player);
  return;
}

Assistant:

static void do_cmd_alter_aux(int dir)
{
	struct loc grid;
	bool more = false;
	struct object *o_chest_closed;
	struct object *o_chest_trapped;

	/* Get location */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Apply confusion */
	if (player_confuse_dir(player, &dir, false)) {
		/* Get location */
		grid = loc_sum(player->grid, ddgrid[dir]);
	}

	/* Check for closed chest */
	o_chest_closed = chest_check(player, grid, CHEST_OPENABLE);
	/* Check for trapped chest */
	o_chest_trapped = chest_check(player, grid, CHEST_TRAPPED);

	/* Action depends on what's there */
	if (square(cave, grid)->mon > 0) {
		/* Attack monster */
		py_attack(player, grid);
	} else if (square_isdiggable(cave, grid)) {
		/* Tunnel through walls and rubble */
		more = do_cmd_tunnel_aux(grid);
	} else if (square_iscloseddoor(cave, grid)) {
		/* Open closed doors */
		more = do_cmd_open_aux(grid);
	} else if (square_isbasicmonstertrap(cave, grid)) {
		/* Modify monster traps */
		modify_monster_trap(grid);
	} else if (square_isdisarmabletrap(cave, grid) ||
			   square_isadvancedmonstertrap(cave, grid)) {
		/* Disarm traps */
		more = do_cmd_disarm_aux(grid);
	} else if (player_has(player, PF_TRAP) && square_istrappable(cave, grid)) {
		/* Set traps */
		do_cmd_set_trap(grid);
	} else if (o_chest_trapped) {
		/* Trapped chest */
		more = do_cmd_disarm_chest(o_chest_trapped);
	} else if (o_chest_closed) {
		/* Open chest */
		more = do_cmd_open_chest(grid, o_chest_closed);
	} else if (square_isopendoor(cave, grid)) {
		/* Close door */
        	more = do_cmd_close_aux(grid);
	} else {
		/* Oops */
		msg("You spin around.");
	}

	/* Cancel repetition unless we can continue */
	if (!more) disturb(player);
}